

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O3

void __thiscall
S2CellIndex::GetIntersectingLabels
          (S2CellIndex *this,S2CellUnion *target,vector<int,_std::allocator<int>_> *labels)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int *piVar10;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  piVar2 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(S2CellId,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc:143:34)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(S2CellId,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc:143:34)>
             ::_M_manager;
  local_38._M_unused._M_object = labels;
  VisitIntersectingCells(this,target,(CellVisitor *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  piVar2 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 != piVar3) {
    uVar6 = (long)piVar3 - (long)piVar2 >> 2;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar2,piVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar2,piVar3);
    piVar10 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar4 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    if (piVar10 != piVar4) {
      piVar10 = piVar10 + 1;
      do {
        piVar7 = piVar10;
        if (piVar7 == piVar4) {
          return;
        }
        piVar10 = piVar7 + 1;
      } while (piVar7[-1] != *piVar7);
      piVar8 = piVar7 + -1;
      iVar9 = piVar7[-1];
      for (; piVar10 != piVar4; piVar10 = piVar10 + 1) {
        iVar1 = *piVar10;
        if (iVar9 != iVar1) {
          piVar8[1] = iVar1;
          piVar8 = piVar8 + 1;
        }
        iVar9 = iVar1;
      }
      if (piVar8 + 1 != piVar4) {
        (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar8 + 1;
      }
    }
  }
  return;
}

Assistant:

void S2CellIndex::GetIntersectingLabels(const S2CellUnion& target,
                                        std::vector<Label>* labels) const {
  labels->clear();
  VisitIntersectingCells(target, [labels](S2CellId cell_id, Label label) {
      labels->push_back(label);
      return true;
    });
  std::sort(labels->begin(), labels->end());
  labels->erase(std::unique(labels->begin(), labels->end()), labels->end());
}